

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

atom * findTouchingAtoms(atom *src,atom *head,atomBins *abins,float probeRad,int targFlg,int *ok)

{
  double dVar1;
  double dVar2;
  double dVar3;
  atom *b;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  atom_t **ppaVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  int jz;
  int jy;
  int jx;
  long local_68;
  uint *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  jx = src->ix;
  jy = src->iy;
  jz = src->iz;
  if (src->binSerialNum != abins->binSerialNum) {
    dVar1 = (src->loc).x;
    dVar13 = (double)abins->delta;
    if (((((dVar1 < (abins->min).x - dVar13) ||
          (dVar2 = (src->loc).y, dVar2 < (abins->min).y - dVar13)) ||
         (dVar3 = (src->loc).z, dVar3 < (abins->min).z - dVar13)) ||
        (((abins->max).x + dVar13 < dVar1 || ((abins->max).y + dVar13 < dVar2)))) ||
       (dVar13 + (abins->max).z < dVar3)) {
      return (atom *)0x0;
    }
    binLoc(&src->loc,&jx,&jy,&jz,abins);
  }
  uVar7 = 2;
  if (2 < jx) {
    uVar7 = (ulong)(uint)jx;
  }
  uVar11 = 2;
  if (2 < jy) {
    uVar11 = (ulong)(uint)jy;
  }
  uVar10 = 2;
  if (2 < jz) {
    uVar10 = (ulong)(uint)jz;
  }
  iVar5 = abins->nx + -2;
  if (jx < iVar5) {
    iVar5 = jx + 1;
  }
  iVar6 = abins->ny + -2;
  if (jy < iVar6) {
    iVar6 = jy + 1;
  }
  iVar4 = abins->nz + -2;
  if (jz < iVar4) {
    iVar4 = jz + 1;
  }
  local_48 = uVar10 - 1;
  local_38 = (long)iVar4;
  local_58 = uVar11 - 1;
  local_40 = (long)iVar6;
  local_50 = (long)iVar5;
  iVar5 = 0;
  local_60 = (uint *)ok;
  for (lVar8 = uVar7 - 1; local_68 = local_58, lVar8 <= local_50; lVar8 = lVar8 + 1) {
    for (; lVar12 = local_48, local_68 <= local_40; local_68 = local_68 + 1) {
      for (; lVar12 <= local_38; lVar12 = lVar12 + 1) {
        ppaVar9 = abins->list[lVar8][local_68] + lVar12;
        while (b = *ppaVar9, b != (atom *)0x0) {
          iVar6 = src->r->model;
          if ((((iVar6 == b->r->model) && ((modelLimit < 2 || (iVar6 == modelToProcess)))) &&
              ((b->altConf == ' ' || ((src->altConf == ' ' || (src->altConf == b->altConf)))))) &&
             (iVar6 = atomsClose(src,b,probeRad), iVar6 != 0)) {
            b->mark = 0;
            b->scratch = head;
            iVar5 = (iVar5 + 1) - (uint)((b->flags & targFlg) == 0);
            head = b;
          }
          ppaVar9 = &b->nextInBin;
        }
      }
    }
  }
  src->mark = 0;
  *local_60 = (uint)(0 < iVar5 || targFlg == 0);
  return head;
}

Assistant:

atom* findTouchingAtoms(atom *src, atom *head, atomBins *abins,
			   float probeRad, int targFlg, int *ok)
{/*findTouchingAtoms()*/
   atom *a = NULL;
   int i = 0, j = 0, k = 0, nearpt = 0, targcount = 0;
   int jx = (src->ix), jy = (src->iy), jz = (src->iz);
   int imin = 0, jmin = 0, kmin = 0;
   int imax = 0, jmax = 0, kmax = 0;

   if (src->binSerialNum != abins->binSerialNum)
   {/*in foreign bins */
      /*dcr?: why do they have to be in foreign==different bins??*/
      /*this requirement seems not to affect loss of close clashes*/

      /* must look up the positions */

      if(  (src->loc.x < (abins->min.x - abins->delta))
	|| (src->loc.y < (abins->min.y - abins->delta))
	|| (src->loc.z < (abins->min.z - abins->delta))
	|| (src->loc.x > (abins->max.x + abins->delta))
	|| (src->loc.y > (abins->max.y + abins->delta))
	|| (src->loc.z > (abins->max.z + abins->delta)) )
      {
	 return NULL; /* nothing anywhere nearby */
      }
      binLoc(&(src->loc), &jx, &jy, &jz, abins);

#ifdef DEBUG_A2B
fprintf(stderr, "f(%c != %c) %s%d %s [%d, %d, %d] <1..%d, 1..%d, 1..%d>\n",
   src->binSerialNum, abins->binSerialNum,
   src->r->resname, src->r->resid, src->atomname, jx, jy, jz, abins->nx-2, abins->ny-2, abins->nz-2);
#endif

   }/*in foreign bins */

   imin = jx-1; imax = jx+1; /* bin ranges */
   jmin = jy-1; jmax = jy+1;
   kmin = jz-1; kmax = jz+1;

   /* trim any excess edges */
   if (imin < 1)               { imin = 1; }
   if (jmin < 1)               { jmin = 1; }
   if (kmin < 1)               { kmin = 1; }
   if (imax > (abins->nx - 2)) { imax = (abins->nx - 2); }
   if (jmax > (abins->ny - 2)) { jmax = (abins->ny - 2); }
   if (kmax > (abins->nz - 2)) { kmax = (abins->nz - 2); }

   for(i = imin; i <= imax; i++) {
      for(j = jmin; j <= jmax; j++) {
         for(k = kmin; k <= kmax; k++) {

	    for(a = abins->list[i][j][k]; a; a = a->nextInBin) {

               /*Lmodeltest for interaction of diff. models 041112*/
               /*050121 Lmodeltest superseded, mage sends model# */
               /*...within subroutine findTouchingAtoms()... */
	       if( (src->r->model != a->r->model) ) { continue; }
               if( modelLimit > 1 ) /*041114*/
               {/*looping through multiple models*/
                  if(src->r->model != modelToProcess) { continue; }
               }

               /*if (( src->r  == a->r)            && -- alternate      */
                                                    /* alternate      */
	       if (( src->altConf != a->altConf) && /* conformations  */
	           ( src->altConf != ' ')        && /* don't interact */
	           (   a->altConf != ' ')     ) { continue; }
            
    
/*nearpt seems to be essential to get any dots or spikes */
/*...seems not to be where too-close atoms fail to get any dots or spikes*/
	       nearpt = atomsClose(src, a, probeRad);/*only call to atomsClose*/
	       if (nearpt)
               {/*add this atom to the linked-list of those touching src atom*/
		  a->mark = 0;       /* clear the bonding marker.   */
		  a->scratch = head; /* link using scratch pointers */
		  head = a;          /* with <a> at head of list    */

		  if (a->flags & targFlg) { targcount++; }
           }
        }
     }
    }
   }
   src->mark = 0;       /* clear the src atom bonding marker.   */

   *ok = !(targFlg && (targcount < 1));

   return head;
}